

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialQueue.cpp
# Opt level: O2

void __thiscall
SerialExecutionQueue::SerialExecutionQueue
          (SerialExecutionQueue *this,ExecutionQueueDelegate *delegate,char **environment)

{
  uint32_t uVar1;
  SerialQueueImpl *this_00;
  random_device rStack_13a8;
  
  llbuild::basic::ExecutionQueue::ExecutionQueue(&this->super_ExecutionQueue,delegate);
  (this->super_ExecutionQueue)._vptr_ExecutionQueue =
       (_func_int **)&PTR__SerialExecutionQueue_001f42b0;
  std::random_device::random_device(&rStack_13a8);
  uVar1 = std::random_device::_M_getval();
  std::random_device::_M_fini();
  this->buildID = uVar1;
  this_00 = (SerialQueueImpl *)operator_new(0xb0);
  anon_unknown.dwarf_1c19eb::SerialQueueImpl::SerialQueueImpl(this_00);
  this->queue = this_00;
  this->environment = environment;
  this->jobCount = 0;
  (this->cancelled)._M_base._M_i = false;
  llbuild::basic::ProcessGroup::ProcessGroup(&this->spawnedProcesses);
  (this->killAfterTimeoutThreadMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->killAfterTimeoutThread)._M_t.
  super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
  super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
  super__Head_base<0UL,_std::thread_*,_false>._M_head_impl = (thread *)0x0;
  *(undefined8 *)((long)&(this->killAfterTimeoutThreadMutex).super___mutex_base._M_mutex + 0x10) = 0
  ;
  (this->killAfterTimeoutThreadMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->killAfterTimeoutThreadMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->killAfterTimeoutThreadMutex).super___mutex_base._M_mutex + 8) = 0;
  std::condition_variable::condition_variable(&this->queueCompleteCondition);
  *(undefined8 *)
   ((long)&(this->queueCompleteMutex).super___mutex_base._M_mutex.__data.__list.__prev + 1) = 0;
  *(undefined8 *)
   ((long)&(this->queueCompleteMutex).super___mutex_base._M_mutex.__data.__list.__next + 1) = 0;
  *(undefined8 *)((long)&(this->queueCompleteMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->queueCompleteMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->queueCompleteMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->queueCompleteMutex).super___mutex_base._M_mutex + 8) = 0;
  return;
}

Assistant:

SerialExecutionQueue(ExecutionQueueDelegate& delegate,
                       const char* const* environment)
  : ExecutionQueue(delegate), buildID(std::random_device()()), queue(new SerialQueueImpl), environment(environment)
  {
  }